

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PlotFileUtil.cpp
# Opt level: O0

void amrex::WriteSingleLevelPlotfile
               (string *plotfilename,MultiFab *mf,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *varnames,Geometry *geom,Real time,int level_step,string *versionName,
               string *levelPrefix,string *mfPrefix,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *extra_dirs)

{
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> ref_ratio;
  Vector<int,_std::allocator<int>_> level_steps;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> geomarr;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> mfarr;
  Vector<int,_std::allocator<int>_> *in_stack_00000230;
  Real in_stack_00000238;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *in_stack_00000240;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000248;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *in_stack_00000250;
  int in_stack_0000025c;
  string *in_stack_00000260;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *in_stack_00000280;
  string *in_stack_00000288;
  string *in_stack_00000290;
  string *in_stack_00000298;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000002a0;
  allocator_type *in_stack_fffffffffffffee8;
  value_type *in_stack_fffffffffffffef0;
  size_type in_stack_fffffffffffffef8;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *in_stack_ffffffffffffff00;
  
  std::allocator<const_amrex::MultiFab_*>::allocator
            ((allocator<const_amrex::MultiFab_*> *)0x12eaf1a);
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
            ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
             in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             (value_type *)in_stack_fffffffffffffef0,(allocator_type *)in_stack_fffffffffffffee8);
  std::allocator<const_amrex::MultiFab_*>::~allocator
            ((allocator<const_amrex::MultiFab_*> *)0x12eaf48);
  std::allocator<amrex::Geometry>::allocator((allocator<amrex::Geometry> *)0x12eaf67);
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
             (allocator_type *)in_stack_fffffffffffffee8);
  std::allocator<amrex::Geometry>::~allocator((allocator<amrex::Geometry> *)0x12eaf92);
  std::allocator<int>::allocator((allocator<int> *)0x12eafa1);
  Vector<int,_std::allocator<int>_>::vector
            ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8,(value_type *)in_stack_fffffffffffffef0,
             in_stack_fffffffffffffee8);
  std::allocator<int>::~allocator((allocator<int> *)0x12eafc9);
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::Vector
            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)0x12eafd8);
  WriteMultiLevelPlotfile
            (in_stack_00000260,in_stack_0000025c,in_stack_00000250,in_stack_00000248,
             in_stack_00000240,in_stack_00000238,in_stack_00000230,in_stack_00000280,
             in_stack_00000288,in_stack_00000290,in_stack_00000298,in_stack_000002a0);
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~Vector
            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)0x12eb057);
  Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x12eb061);
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::~Vector
            ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)0x12eb06e);
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::~Vector
            ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)0x12eb07b)
  ;
  return;
}

Assistant:

void
WriteSingleLevelPlotfile (const std::string& plotfilename,
                          const MultiFab& mf, const Vector<std::string>& varnames,
                          const Geometry& geom, Real time, int level_step,
                          const std::string &versionName,
                          const std::string &levelPrefix,
                          const std::string &mfPrefix,
                          const Vector<std::string>& extra_dirs)
{
    Vector<const MultiFab*> mfarr(1,&mf);
    Vector<Geometry> geomarr(1,geom);
    Vector<int> level_steps(1,level_step);
    Vector<IntVect> ref_ratio;

    WriteMultiLevelPlotfile(plotfilename, 1, mfarr, varnames, geomarr, time,
                            level_steps, ref_ratio, versionName, levelPrefix, mfPrefix, extra_dirs);
}